

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_finalize(sqlite3_stmt *pStmt)

{
  sqlite3 *db_00;
  int iVar1;
  sqlite3 *db;
  Vdbe *v;
  int rc;
  sqlite3_stmt *pStmt_local;
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    v._4_4_ = 0;
  }
  else {
    db_00 = *(sqlite3 **)pStmt;
    iVar1 = vdbeSafety((Vdbe *)pStmt);
    if (iVar1 != 0) {
      iVar1 = sqlite3MisuseError(0xf72a);
      return iVar1;
    }
    sqlite3_mutex_enter(db_00->mutex);
    iVar1 = sqlite3VdbeFinalize((Vdbe *)pStmt);
    v._4_4_ = sqlite3ApiExit(db_00,iVar1);
    sqlite3LeaveMutexAndCloseZombie(db_00);
  }
  return v._4_4_;
}

Assistant:

SQLITE_API int sqlite3_finalize(sqlite3_stmt *pStmt){
  int rc;
  if( pStmt==0 ){
    /* IMPLEMENTATION-OF: R-57228-12904 Invoking sqlite3_finalize() on a NULL
    ** pointer is a harmless no-op. */
    rc = SQLITE_OK;
  }else{
    Vdbe *v = (Vdbe*)pStmt;
    sqlite3 *db = v->db;
    if( vdbeSafety(v) ) return SQLITE_MISUSE_BKPT;
    sqlite3_mutex_enter(db->mutex);
    rc = sqlite3VdbeFinalize(v);
    rc = sqlite3ApiExit(db, rc);
    sqlite3LeaveMutexAndCloseZombie(db);
  }
  return rc;
}